

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_164db4ee comp)

{
  pdqsort_detail *ppVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  ComponentData *pCVar7;
  ulong uVar8;
  long lVar9;
  pdqsort_detail *ppVar10;
  bool local_6d;
  long local_50;
  
  pCVar7 = comp.componentData;
  if (this == (pdqsort_detail *)begin._M_current) {
    local_6d = true;
  }
  else {
    local_50 = 0;
    uVar8 = 0;
    ppVar10 = this;
    do {
      ppVar1 = ppVar10 + 4;
      local_6d = ppVar1 == (pdqsort_detail *)begin._M_current;
      if (local_6d) {
        return local_6d;
      }
      iVar2 = *(int *)ppVar10;
      HVar5 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         (pCVar7->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish[*(int *)(ppVar10 + 4)]);
      HVar6 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         (pCVar7->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar5 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar6 * 4);
      if ((iVar2 == 1) || (iVar3 != 1)) {
        if ((HVar5 < HVar6) && (iVar2 != 1 || iVar3 == 1)) goto LAB_00305c0b;
      }
      else {
LAB_00305c0b:
        iVar2 = *(int *)(ppVar10 + 4);
        *(int *)(ppVar10 + 4) = *(int *)ppVar10;
        if (ppVar10 != this) {
          lVar9 = 0;
          do {
            iVar3 = *(int *)(ppVar10 + lVar9 + -4);
            HVar5 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               (pCVar7->permComponentStarts).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish[iVar2]);
            HVar6 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               (pCVar7->permComponentStarts).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish[iVar3]);
            iVar3 = *(int *)(*(long *)end._M_current + (long)HVar5 * 4);
            iVar4 = *(int *)(*(long *)end._M_current + (long)HVar6 * 4);
            if ((iVar3 == 1) || (iVar4 != 1)) {
              if ((HVar6 <= HVar5) || (iVar3 == 1 && iVar4 != 1)) break;
            }
            *(undefined4 *)(ppVar10 + lVar9) = *(undefined4 *)(ppVar10 + lVar9 + -4);
            lVar9 = lVar9 + -4;
          } while (local_50 != lVar9);
          ppVar10 = ppVar10 + lVar9;
        }
        *(int *)ppVar10 = iVar2;
        uVar8 = uVar8 + ((long)ppVar1 - (long)ppVar10 >> 2);
      }
      local_50 = local_50 + -4;
      ppVar10 = ppVar1;
    } while (uVar8 < 9);
  }
  return local_6d;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }